

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprintconv.cpp
# Opt level: O2

void doit(void)

{
  uLongf uVar1;
  longlong __n;
  FILE *__stream;
  FILE *pFVar2;
  FILE *__stream_00;
  size_t sVar3;
  char *__ptr;
  int iVar4;
  long lVar5;
  uLongf len;
  FILE *local_b8;
  int hasIntensityUncertainty;
  vector<EventRow,_std::allocator<EventRow>_> rv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rvz;
  EventIndex out_idx;
  EventIndex in_idx;
  int intensity_bins;
  
  __stream = fopen("footprint.bin","rb");
  pFVar2 = fopen("footprint.idx","rb");
  if (__stream == (FILE *)0x0) {
    __ptr = "File not found footprint.bin\n";
  }
  else {
    if (pFVar2 != (FILE *)0x0) {
      local_b8 = pFVar2;
      pFVar2 = fopen("footprint.bin.z","wb");
      __stream_00 = fopen("footprint.idx.z","wb");
      intensity_bins = 0;
      hasIntensityUncertainty = 0;
      fread(&intensity_bins,4,1,__stream);
      fread(&hasIntensityUncertainty,4,1,__stream);
      lVar5 = 0;
      fprintf(_stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",(ulong)(uint)intensity_bins
              ,(ulong)(uint)hasIntensityUncertainty);
      fwrite(&intensity_bins,4,1,pFVar2);
      fwrite(&hasIntensityUncertainty,4,1,pFVar2);
      sVar3 = fread(&in_idx,0x14,1,local_b8);
      rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out_idx.offset = 8;
      iVar4 = 0;
      while (sVar3 != 0) {
        fseek(__stream,in_idx.offset,0);
        __n = in_idx.size;
        std::vector<EventRow,_std::allocator<EventRow>_>::resize(&rv,in_idx.size);
        fread(rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
              super__Vector_impl_data._M_start,4,__n,__stream);
        if (rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&rvz,(long)rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                              super__Vector_impl_data._M_finish +
                        (0x400 - (long)rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
        len = (long)rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        compress(rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,&len,
                 rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                 super__Vector_impl_data._M_start,__n);
        uVar1 = len;
        fwrite(rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,len,1,pFVar2);
        out_idx.event_id = in_idx.event_id;
        out_idx.size = len;
        fwrite(&out_idx,0x14,1,__stream_00);
        out_idx.offset = out_idx.offset + len;
        if (rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
            super__Vector_impl_data._M_start) {
          rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data
          ._M_finish = rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + __n;
        iVar4 = iVar4 + (int)uVar1;
        sVar3 = fread(&in_idx,0x14,1,local_b8);
      }
      printf("TODO: expected input size  %zd\n",lVar5 + 8);
      printf("TODO: expected output size  %d\n",(ulong)(iVar4 + 8));
      fclose(pFVar2);
      fclose(__stream_00);
      fclose(__stream);
      fclose(local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<EventRow,_std::allocator<EventRow>_>::~_Vector_base
                (&rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>);
      return;
    }
    __ptr = "File not found footprint.idx\n";
    local_b8 = (FILE *)0x0;
  }
  fwrite(__ptr,0x1d,1,_stderr);
  exit(-1);
}

Assistant:

void doit()
{
    FILE *finx = fopen("footprint.bin", "rb");
	FILE *finy = fopen("footprint.idx", "rb");
    if (finx == NULL) {
        fprintf(stderr,"File not found footprint.bin\n");
        exit(-1);
    }
    if (finy == NULL) {
        fprintf(stderr,"File not found footprint.idx\n");
        exit(-1);
    }


    FILE *foutx = fopen("footprint.bin.z", "wb");
    FILE *fouty = fopen("footprint.idx.z", "wb");
    int intensity_bins = 0;
    int hasIntensityUncertainty =0;
    fread(&intensity_bins, sizeof(intensity_bins), 1, finx);
    fread(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, finx);
    fprintf(stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",intensity_bins,hasIntensityUncertainty);
    fwrite(&intensity_bins, sizeof(intensity_bins), 1, foutx);
    fwrite(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, foutx);

    EventIndex in_idx;
    EventIndex out_idx;
    size_t i = fread(&in_idx, sizeof(in_idx), 1, finy);
    std::vector<EventRow> rv;
    std::vector<unsigned char> rvz;
    size_t total_insize = 0;
    int total_outsize = 0;
    out_idx.offset = 8;
    while (i != 0) {
		flseek(finx, in_idx.offset, SEEK_SET);                
        rv.resize(in_idx.size);
        total_insize += in_idx.size;
        fread(&rv[0], sizeof(1), in_idx.size,finx);
        rvz.clear();
        rvz.resize(rv.size() * sizeof(EventRow) + 1024);
        uLongf len = (uLongf)rvz.size();
        compress(&rvz[0], &len, (unsigned char *)&rv[0], in_idx.size);
        total_outsize += len;
        fwrite((unsigned char *)&rvz[0], len, 1, foutx);
        out_idx.event_id = in_idx.event_id;        
        out_idx.size = len;
        fwrite(&out_idx, sizeof(out_idx), 1, fouty);
        // fprintf(stderr,"%d, %ld, %d\n", in_idx.event_id, in_idx.offset, in_idx.size);
        // fprintf(stderr,"%d, %ld, %d\n", out_idx.event_id, out_idx.offset, out_idx.size);
    /*  
        long long j=0;  
	    while (j < in_idx.size) {
            EventRow row;
            fread(&row, sizeof(row), 1,finx);
            // printf("%d, %d, %d, %.10e\n", in_idx.event_id,row.areaperil_id,row.intensity_bin_id, row.probability);

            j += sizeof(row);
	    }
*/
        out_idx.offset += len;;                
        rv.clear();
        i = fread(&in_idx, sizeof(in_idx), 1, finy);
    }

    printf("TODO: expected input size  %zd\n",total_insize+8);
    printf("TODO: expected output size  %d\n",total_outsize+8);
    fclose(foutx);
    fclose(fouty);
    fclose(finx);
    fclose(finy);
}